

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O3

int __thiscall ncnn::InnerProduct::load_model(InnerProduct *this,ModelBin *mb)

{
  Mat *this_00;
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  bool bVar4;
  int iVar5;
  Option opt_q;
  Mat local_150;
  Mat local_108;
  Mat local_b8;
  Option local_70;
  
  (*mb->_vptr_ModelBin[2])(&local_150,mb,(ulong)(uint)this->weight_data_size,0);
  this_00 = &this->weight_data;
  if (this_00 != &local_150) {
    if (local_150.refcount != (int *)0x0) {
      LOCK();
      *local_150.refcount = *local_150.refcount + 1;
      UNLOCK();
    }
    piVar1 = (this->weight_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->weight_data).data;
        pAVar3 = (this->weight_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
          }
        }
        else {
          (*pAVar3->_vptr_Allocator[3])();
        }
      }
    }
    (this->weight_data).data = local_150.data;
    (this->weight_data).refcount = local_150.refcount;
    (this->weight_data).elemsize = local_150.elemsize;
    (this->weight_data).elempack = local_150.elempack;
    (this->weight_data).allocator = local_150.allocator;
    (this->weight_data).dims = local_150.dims;
    (this->weight_data).w = local_150.w;
    (this->weight_data).h = local_150.h;
    (this->weight_data).d = local_150.d;
    (this->weight_data).c = local_150.c;
    (this->weight_data).cstep = local_150.cstep;
  }
  if (local_150.refcount != (int *)0x0) {
    LOCK();
    *local_150.refcount = *local_150.refcount + -1;
    UNLOCK();
    if (*local_150.refcount == 0) {
      if (local_150.allocator == (Allocator *)0x0) {
        if (local_150.data != (void *)0x0) {
          free(local_150.data);
        }
      }
      else {
        (*(local_150.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar5 = -100;
  if ((this_00->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (*mb->_vptr_ModelBin[2])(&local_150,mb,(ulong)(uint)this->num_output,1);
      if (&this->bias_data != &local_150) {
        if (local_150.refcount != (int *)0x0) {
          LOCK();
          *local_150.refcount = *local_150.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->bias_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->bias_data).data;
            pAVar3 = (this->bias_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->bias_data).data = local_150.data;
        (this->bias_data).refcount = local_150.refcount;
        (this->bias_data).elemsize = local_150.elemsize;
        (this->bias_data).elempack = local_150.elempack;
        (this->bias_data).allocator = local_150.allocator;
        (this->bias_data).dims = local_150.dims;
        (this->bias_data).w = local_150.w;
        (this->bias_data).h = local_150.h;
        (this->bias_data).d = local_150.d;
        (this->bias_data).c = local_150.c;
        (this->bias_data).cstep = local_150.cstep;
      }
      if (local_150.refcount != (int *)0x0) {
        LOCK();
        *local_150.refcount = *local_150.refcount + -1;
        UNLOCK();
        if (*local_150.refcount == 0) {
          if (local_150.allocator == (Allocator *)0x0) {
            if (local_150.data != (void *)0x0) {
              free(local_150.data);
            }
          }
          else {
            (*(local_150.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    if (this->int8_scale_term != 0) {
      (*mb->_vptr_ModelBin[2])(&local_150,mb,(ulong)(uint)this->num_output,1);
      if (&this->weight_data_int8_scales != &local_150) {
        if (local_150.refcount != (int *)0x0) {
          LOCK();
          *local_150.refcount = *local_150.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_data_int8_scales).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->weight_data_int8_scales).data;
            pAVar3 = (this->weight_data_int8_scales).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_int8_scales).data = local_150.data;
        (this->weight_data_int8_scales).refcount = local_150.refcount;
        (this->weight_data_int8_scales).elemsize = local_150.elemsize;
        (this->weight_data_int8_scales).elempack = local_150.elempack;
        (this->weight_data_int8_scales).allocator = local_150.allocator;
        (this->weight_data_int8_scales).dims = local_150.dims;
        (this->weight_data_int8_scales).w = local_150.w;
        (this->weight_data_int8_scales).h = local_150.h;
        (this->weight_data_int8_scales).d = local_150.d;
        (this->weight_data_int8_scales).c = local_150.c;
        (this->weight_data_int8_scales).cstep = local_150.cstep;
      }
      if (local_150.refcount != (int *)0x0) {
        LOCK();
        *local_150.refcount = *local_150.refcount + -1;
        UNLOCK();
        if (*local_150.refcount == 0) {
          if (local_150.allocator == (Allocator *)0x0) {
            if (local_150.data != (void *)0x0) {
              free(local_150.data);
            }
          }
          else {
            (*(local_150.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      (*mb->_vptr_ModelBin[2])(&local_150,mb,1,1);
      if (&this->bottom_blob_int8_scales != &local_150) {
        if (local_150.refcount != (int *)0x0) {
          LOCK();
          *local_150.refcount = *local_150.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->bottom_blob_int8_scales).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->bottom_blob_int8_scales).data;
            pAVar3 = (this->bottom_blob_int8_scales).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(pvVar2);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->bottom_blob_int8_scales).data = local_150.data;
        (this->bottom_blob_int8_scales).refcount = local_150.refcount;
        (this->bottom_blob_int8_scales).elemsize = local_150.elemsize;
        (this->bottom_blob_int8_scales).elempack = local_150.elempack;
        (this->bottom_blob_int8_scales).allocator = local_150.allocator;
        (this->bottom_blob_int8_scales).dims = local_150.dims;
        (this->bottom_blob_int8_scales).w = local_150.w;
        (this->bottom_blob_int8_scales).h = local_150.h;
        (this->bottom_blob_int8_scales).d = local_150.d;
        (this->bottom_blob_int8_scales).c = local_150.c;
        (this->bottom_blob_int8_scales).cstep = local_150.cstep;
      }
      if (local_150.refcount != (int *)0x0) {
        LOCK();
        *local_150.refcount = *local_150.refcount + -1;
        UNLOCK();
        if (*local_150.refcount == 0) {
          if (local_150.allocator == (Allocator *)0x0) {
            if (local_150.data != (void *)0x0) {
              free(local_150.data);
            }
          }
          else {
            (*(local_150.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if (((this->weight_data).elemsize == 4) && (this->int8_scale_term != 0)) {
        Mat::reshape(&local_150,this_00,this->weight_data_size / this->num_output,this->num_output,
                     (Allocator *)0x0);
        local_108.cstep = 0;
        local_108.data = (void *)0x0;
        local_108.refcount._0_4_ = 0;
        local_108.refcount._4_4_ = 0;
        local_108.elemsize._0_4_ = 0;
        local_108._20_8_ = 0;
        local_108.allocator = (Allocator *)0x0;
        local_108.dims = 0;
        local_108.w = 0;
        local_108.h = 0;
        local_108.d = 0;
        local_108.c = 0;
        Option::Option(&local_70);
        local_70.num_threads = 1;
        local_70.use_packing_layout = false;
        quantize_to_int8(&local_150,&local_108,&this->weight_data_int8_scales,&local_70);
        if ((local_108.data == (void *)0x0) || ((long)local_108.c * local_108.cstep == 0)) {
          bVar4 = false;
        }
        else {
          Mat::reshape(&local_b8,&local_108,this->weight_data_size,(Allocator *)0x0);
          if (this_00 != &local_b8) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar1 = (this->weight_data).refcount;
            if (piVar1 != (int *)0x0) {
              LOCK();
              *piVar1 = *piVar1 + -1;
              UNLOCK();
              if (*piVar1 == 0) {
                pvVar2 = (this->weight_data).data;
                pAVar3 = (this->weight_data).allocator;
                if (pAVar3 == (Allocator *)0x0) {
                  if (pvVar2 != (void *)0x0) {
                    free(pvVar2);
                  }
                }
                else {
                  (*pAVar3->_vptr_Allocator[3])();
                }
              }
            }
            (this->weight_data).data = local_b8.data;
            (this->weight_data).refcount = local_b8.refcount;
            (this->weight_data).elemsize = local_b8.elemsize;
            (this->weight_data).elempack = local_b8.elempack;
            (this->weight_data).allocator = local_b8.allocator;
            (this->weight_data).dims = local_b8.dims;
            (this->weight_data).w = local_b8.w;
            (this->weight_data).h = local_b8.h;
            (this->weight_data).d = local_b8.d;
            (this->weight_data).c = local_b8.c;
            (this->weight_data).cstep = local_b8.cstep;
          }
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + -1;
            UNLOCK();
            if (*local_b8.refcount == 0) {
              if (local_b8.allocator == (Allocator *)0x0) {
                if (local_b8.data != (void *)0x0) {
                  free(local_b8.data);
                }
              }
              else {
                (*(local_b8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bVar4 = true;
        }
        piVar1 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            if (local_108.allocator == (Allocator *)0x0) {
              if (local_108.data != (void *)0x0) {
                free(local_108.data);
              }
            }
            else {
              (*(local_108.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (local_150.refcount != (int *)0x0) {
          LOCK();
          *local_150.refcount = *local_150.refcount + -1;
          UNLOCK();
          if (*local_150.refcount == 0) {
            if (local_150.allocator == (Allocator *)0x0) {
              if (local_150.data != (void *)0x0) {
                free(local_150.data);
              }
            }
            else {
              (*(local_150.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if (!bVar4) {
          return -100;
        }
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int InnerProduct::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

#if NCNN_INT8
    if (int8_scale_term)
    {
        weight_data_int8_scales = mb.load(num_output, 1);
        bottom_blob_int8_scales = mb.load(1, 1);
    }
#endif // NCNN_INT8

#if NCNN_INT8
    // runtime quantize the weight data
    if (weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int num_input = weight_data_size / num_output;

        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        Mat weight_data_int8;
        Option opt_q;
        opt_q.num_threads = 1;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#endif // NCNN_INT8

    return 0;
}